

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

Vec_Ptr_t *
Abc_NodeCollectTfoCands(Abc_ManCut_t *p,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,int LevelMax)

{
  size_t __size;
  undefined4 uVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long *plVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int *__s;
  Vec_Vec_t *pVVar9;
  void *pvVar10;
  void **ppvVar11;
  long lVar12;
  uint uVar13;
  int Fill;
  int Fill_00;
  Vec_Ptr_t *pVVar14;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  Vec_Ptr_t *extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar15;
  
  pAVar2 = pRoot->pNtk;
  if (pAVar2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2c1,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  pVVar8 = (Vec_Ptr_t *)(long)p->vLevels->nSize;
  pVVar14 = vLeaves;
  if (0 < (long)pVVar8) {
    pVVar14 = (Vec_Ptr_t *)0x0;
    do {
      if (*(int *)((long)p->vLevels->pArray[(long)pVVar14] + 4) != 0) {
        __assert_fail("vVec->nSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                      ,0x2c5,
                      "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      pVVar14 = (Vec_Ptr_t *)((long)&pVVar14->nCap + 1);
    } while (pVVar8 != pVVar14);
  }
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar6 = pAVar2->vObjs->nSize;
    uVar17 = (long)iVar6 + 500;
    iVar16 = (int)uVar17;
    if ((pAVar2->vTravIds).nCap < iVar16) {
      __s = (int *)malloc(uVar17 * 4);
      (pAVar2->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar16;
      pVVar14 = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar6) {
      memset(__s,0,(uVar17 & 0xffffffff) << 2);
      pVVar14 = extraout_RDX_00;
    }
    (pAVar2->vTravIds).nSize = iVar16;
  }
  iVar6 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  iVar6 = vLeaves->nSize;
  if (0 < iVar6) {
    uVar18 = 0xffffffff;
    lVar19 = 0;
    do {
      plVar3 = (long *)vLeaves->pArray[lVar19];
      if (*(uint *)((long)plVar3 + 0x14) >> 0xc <= (uint)LevelMax) {
        lVar20 = *plVar3;
        iVar6 = (int)plVar3[2];
        uVar1 = *(undefined4 *)(lVar20 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar6 + 1,(int)pVVar14);
        if (((long)iVar6 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar6)) {
LAB_002fea7f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar20 + 0xe8) + (long)iVar6 * 4) = uVar1;
        Vec_VecPush(p->vLevels,*(uint *)((long)plVar3 + 0x14) >> 0xc,plVar3);
        uVar7 = *(uint *)((long)plVar3 + 0x14) >> 0xc;
        if ((int)uVar18 <= (int)uVar7) {
          uVar18 = uVar7;
        }
        iVar6 = vLeaves->nSize;
        pVVar14 = extraout_RDX_01;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar6);
    if (-1 < (int)uVar18) {
      Abc_NodeMffcLabelAig(pRoot);
      p->vNodesTfo->nSize = 0;
      pVVar9 = p->vLevels;
      iVar6 = pVVar9->nSize;
      if ((int)uVar18 < iVar6) {
        uVar17 = (ulong)uVar18;
        do {
          pVVar9 = p->vLevels;
          iVar6 = pVVar9->nSize;
          iVar16 = (int)uVar17;
          if (iVar6 <= iVar16) {
LAB_002fea60:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          lVar19 = 0;
          while ((pvVar10 = pVVar9->pArray[uVar17], lVar19 < *(int *)((long)pvVar10 + 4) &&
                 (iVar16 <= LevelMax))) {
            plVar3 = *(long **)(*(long *)((long)pvVar10 + 8) + lVar19 * 8);
            lVar20 = *plVar3;
            iVar6 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar6 + 1,(int)pvVar10);
            if (((long)iVar6 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar6)) {
LAB_002fea41:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar15 = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar20 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar3 + 0xd8)) {
LAB_002fe6ea:
              if (0 < *(int *)((long)plVar3 + 0x2c)) {
                lVar20 = 0;
                do {
                  plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                     (long)*(int *)(plVar3[6] + lVar20 * 4) * 8);
                  if ((*(uint *)((long)plVar4 + 0x14) >> 0xc <= (uint)LevelMax) &&
                     (1 < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 3)) {
                    lVar12 = *plVar4;
                    iVar6 = (int)plVar4[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar6 + 1,(int)uVar15);
                    if (((long)iVar6 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar6)) goto LAB_002fea41;
                    uVar15 = extraout_RDX_03;
                    if (*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar6 * 4) !=
                        *(int *)(*plVar4 + 0xd8)) {
                      pVVar9 = p->vLevels;
                      uVar7 = *(uint *)((long)plVar4 + 0x14) >> 0xc;
                      if ((int)uVar7 < pVVar9->nSize) {
                        puVar5 = (uint *)pVVar9->pArray[uVar7];
                        uVar7 = puVar5[1];
                        if (0 < (long)(int)uVar7) {
                          lVar12 = 0;
                          do {
                            if (*(long **)(*(long *)(puVar5 + 2) + lVar12 * 8) == plVar4)
                            goto LAB_002fe843;
                            lVar12 = lVar12 + 1;
                          } while ((int)uVar7 != lVar12);
                        }
                        if (uVar7 == *puVar5) {
                          if ((int)uVar7 < 0x10) {
                            if (*(void **)(puVar5 + 2) == (void *)0x0) {
                              pvVar10 = malloc(0x80);
                            }
                            else {
                              pvVar10 = realloc(*(void **)(puVar5 + 2),0x80);
                            }
                            *(void **)(puVar5 + 2) = pvVar10;
                            *puVar5 = 0x10;
                          }
                          else {
                            __size = (ulong)(uVar7 * 2) * 8;
                            if (*(void **)(puVar5 + 2) == (void *)0x0) {
                              pvVar10 = malloc(__size);
                            }
                            else {
                              pvVar10 = realloc(*(void **)(puVar5 + 2),__size);
                            }
                            *(void **)(puVar5 + 2) = pvVar10;
                            *puVar5 = uVar7 * 2;
                          }
                        }
                        else {
                          pvVar10 = *(void **)(puVar5 + 2);
                        }
                        uVar7 = puVar5[1];
                        uVar13 = uVar7 + 1;
                        uVar15 = (ulong)uVar13;
                        puVar5[1] = uVar13;
                        *(long **)((long)pvVar10 + (long)(int)uVar7 * 8) = plVar4;
                      }
                      else {
                        Vec_VecPush(pVVar9,uVar7,plVar4);
                        uVar15 = extraout_RDX_04;
                      }
                    }
                  }
LAB_002fe843:
                  lVar20 = lVar20 + 1;
                } while (lVar20 < *(int *)((long)plVar3 + 0x2c));
              }
            }
            else {
              plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)plVar3[4] * 8);
              lVar20 = *plVar4;
              iVar6 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar6 + 1,(int)extraout_RDX_02);
              if (((long)iVar6 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar6)) goto LAB_002fea41;
              if (*(int *)(*(long *)(lVar20 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar4 + 0xd8))
              {
                plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                   (long)*(int *)(plVar3[4] + 4) * 8);
                lVar20 = *plVar4;
                iVar6 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar6 + 1,Fill);
                if (((long)iVar6 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar6)) goto LAB_002fea41;
                if (*(int *)(*(long *)(lVar20 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar4 + 0xd8)
                   ) {
                  pVVar14 = p->vNodesTfo;
                  uVar7 = pVVar14->nSize;
                  if (uVar7 == pVVar14->nCap) {
                    if ((int)uVar7 < 0x10) {
                      if (pVVar14->pArray == (void **)0x0) {
                        ppvVar11 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar11 = (void **)realloc(pVVar14->pArray,0x80);
                      }
                      pVVar14->pArray = ppvVar11;
                      pVVar14->nCap = 0x10;
                    }
                    else {
                      if (pVVar14->pArray == (void **)0x0) {
                        ppvVar11 = (void **)malloc((ulong)uVar7 << 4);
                      }
                      else {
                        ppvVar11 = (void **)realloc(pVVar14->pArray,(ulong)uVar7 << 4);
                      }
                      pVVar14->pArray = ppvVar11;
                      pVVar14->nCap = uVar7 * 2;
                    }
                  }
                  else {
                    ppvVar11 = pVVar14->pArray;
                  }
                  iVar6 = pVVar14->nSize;
                  Fill_00 = iVar6 + 1;
                  pVVar14->nSize = Fill_00;
                  ppvVar11[iVar6] = plVar3;
                  lVar20 = *plVar3;
                  iVar6 = (int)plVar3[2];
                  uVar1 = *(undefined4 *)(lVar20 + 0xd8);
                  Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar6 + 1,Fill_00);
                  if ((-1 < (long)iVar6) && (iVar6 < *(int *)(lVar20 + 0xe4))) {
                    *(undefined4 *)(*(long *)(lVar20 + 0xe8) + (long)iVar6 * 4) = uVar1;
                    uVar15 = extraout_RDX_05;
                    goto LAB_002fe6ea;
                  }
                  goto LAB_002fea7f;
                }
              }
            }
            lVar19 = lVar19 + 1;
            pVVar9 = p->vLevels;
            iVar6 = pVVar9->nSize;
            if (iVar6 <= iVar16) goto LAB_002fea60;
          }
          uVar17 = uVar17 + 1;
        } while ((int)uVar17 < iVar6);
      }
      if ((int)uVar18 < iVar6) {
        uVar17 = (ulong)uVar18;
        do {
          if (LevelMax < (int)uVar17) break;
          *(undefined4 *)((long)pVVar9->pArray[uVar17] + 4) = 0;
          uVar17 = uVar17 + 1;
        } while ((int)uVar17 < iVar6);
      }
      return p->vNodesTfo;
    }
  }
  __assert_fail("LevelMin >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                ,0x2d3,
                "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)")
  ;
}

Assistant:

Vec_Ptr_t * Abc_NodeCollectTfoCands( Abc_ManCut_t * p, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, int LevelMax )
{
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    Vec_Ptr_t * vVec;
    Abc_Obj_t * pNode, * pFanout;
    int i, k, v, LevelMin;
    assert( Abc_NtkIsStrash(pNtk) );

    // assuming that the structure is clean
    Vec_VecForEachLevel( p->vLevels, vVec, i )
        assert( vVec->nSize == 0 );

    // put fanins into the structure while labeling them
    Abc_NtkIncrementTravId( pNtk );
    LevelMin = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        if ( pNode->Level > (unsigned)LevelMax )
            continue;
        Abc_NodeSetTravIdCurrent( pNode );
        Vec_VecPush( p->vLevels, pNode->Level, pNode );
        if ( LevelMin < (int)pNode->Level )
            LevelMin = pNode->Level;
    }
    assert( LevelMin >= 0 );

    // mark MFFC 
    if ( pRoot )
        Abc_NodeMffcLabelAig( pRoot );

    // go through the levels up
    Vec_PtrClear( p->vNodesTfo );
    Vec_VecForEachEntryStart( Abc_Obj_t *, p->vLevels, pNode, i, k, LevelMin )
    {
        if ( i > LevelMax )
            break;
        // if the node is not marked, it is not a fanin
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
        {
            // check if it belongs to the TFO
            if ( !Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pNode)) || 
                 !Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pNode)) )
                 continue;
            // save the node in the TFO and label it
            Vec_PtrPush( p->vNodesTfo, pNode );
            Abc_NodeSetTravIdCurrent( pNode );
        }
        // go through the fanouts and add them to the structure if they meet the conditions
        Abc_ObjForEachFanout( pNode, pFanout, v )
        {
            // skip if fanout is a CO or its level exceeds
            if ( Abc_ObjIsCo(pFanout) || pFanout->Level > (unsigned)LevelMax )
                continue;
            // skip if it is already added or if it is in MFFC
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // add it to the structure but do not mark it (until tested later)
            Vec_VecPushUnique( p->vLevels, pFanout->Level, pFanout );
        }
    }

    // clear the levelized structure
    Vec_VecForEachLevelStart( p->vLevels, vVec, i, LevelMin )
    {
        if ( i > LevelMax )
            break;
        Vec_PtrClear( vVec );
    }
    return p->vNodesTfo;
}